

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint local_10;
  uint count_error;
  
  printf("Starting unit tests:\r\n");
  iVar1 = pal_temperature_get_success();
  local_10 = (uint)(iVar1 != 0);
  iVar1 = pal_temperature_get_with_null_pointer_fail();
  if (iVar1 != 0) {
    local_10 = local_10 + 1;
  }
  iVar1 = pal_fan_set_speed_hi_success();
  if (iVar1 != 0) {
    local_10 = local_10 + 1;
  }
  iVar1 = pal_fan_set_speed_low_success();
  if (iVar1 != 0) {
    local_10 = local_10 + 1;
  }
  printf("End unit tests with %u errors\r\n",(ulong)local_10);
  return local_10;
}

Assistant:

int main(void)
{
    unsigned int count_error = 0;

    printf("Starting unit tests:\r\n");

    if (pal_temperature_get_success() != 0) count_error++;
    if (pal_temperature_get_with_null_pointer_fail() != 0) count_error++;
    if (pal_fan_set_speed_hi_success() != 0) count_error++;
    if (pal_fan_set_speed_low_success() != 0) count_error++;

    printf("End unit tests with %u errors\r\n", count_error);

    return count_error;
}